

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

unique_ptr<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>_>
 __thiscall
pstore::sparse_array<int,unsigned_int>::
make_unique<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (sparse_array<int,unsigned_int> *this,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          first_index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          last_index,__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_value,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_value)

{
  pointer __p;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last_value_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_value_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  last_index_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  first_index_local;
  
  __p = (pointer)new<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                           (8,first_index,last_index);
  sparse_array<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((sparse_array<int,unsigned_int> *)__p,first_index,last_index,first_value,last_value);
  std::
  unique_ptr<pstore::sparse_array<int,unsigned_int>,std::default_delete<pstore::sparse_array<int,unsigned_int>>>
  ::unique_ptr<std::default_delete<pstore::sparse_array<int,unsigned_int>>,void>
            ((unique_ptr<pstore::sparse_array<int,unsigned_int>,std::default_delete<pstore::sparse_array<int,unsigned_int>>>
              *)this,__p);
  return (__uniq_ptr_data<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_unsigned_int>,_std::default_delete<pstore::sparse_array<int,_unsigned_int>_>,_true,_true>
            )this;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           IteratorV first_value,
                                                           IteratorV last_value)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, first_value, last_value)};
    }